

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O0

bool __thiscall
cmCMakeHostSystemInformationCommand::GetValue
          (cmCMakeHostSystemInformationCommand *this,SystemInformation *info,string *key,
          string *value)

{
  bool bVar1;
  uint uVar2;
  char *value_00;
  size_t sVar3;
  undefined1 local_180 [8];
  string e;
  string local_140;
  string local_120;
  string local_100;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string *local_30;
  string *value_local;
  string *key_local;
  SystemInformation *info_local;
  cmCMakeHostSystemInformationCommand *this_local;
  
  local_30 = value;
  value_local = key;
  key_local = (string *)info;
  info_local = (SystemInformation *)this;
  bVar1 = std::operator==(key,"NUMBER_OF_LOGICAL_CORES");
  if (bVar1) {
    uVar2 = cmsys::SystemInformation::GetNumberOfLogicalCPU((SystemInformation *)key_local);
    ValueToString_abi_cxx11_(&local_50,this,(ulong)uVar2);
    std::__cxx11::string::operator=((string *)local_30,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    bVar1 = std::operator==(value_local,"NUMBER_OF_PHYSICAL_CORES");
    if (bVar1) {
      uVar2 = cmsys::SystemInformation::GetNumberOfPhysicalCPU((SystemInformation *)key_local);
      ValueToString_abi_cxx11_(&local_70,this,(ulong)uVar2);
      std::__cxx11::string::operator=((string *)local_30,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    else {
      bVar1 = std::operator==(value_local,"HOSTNAME");
      if (bVar1) {
        value_00 = cmsys::SystemInformation::GetHostname((SystemInformation *)key_local);
        ValueToString_abi_cxx11_(&local_90,this,value_00);
        std::__cxx11::string::operator=((string *)local_30,(string *)&local_90);
        std::__cxx11::string::~string((string *)&local_90);
      }
      else {
        bVar1 = std::operator==(value_local,"FQDN");
        if (bVar1) {
          cmsys::SystemInformation::GetFullyQualifiedDomainName_abi_cxx11_
                    (&local_d0,(SystemInformation *)key_local);
          ValueToString(&local_b0,this,&local_d0);
          std::__cxx11::string::operator=((string *)local_30,(string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_d0);
        }
        else {
          bVar1 = std::operator==(value_local,"TOTAL_VIRTUAL_MEMORY");
          if (bVar1) {
            sVar3 = cmsys::SystemInformation::GetTotalVirtualMemory((SystemInformation *)key_local);
            ValueToString_abi_cxx11_(&local_100,this,sVar3);
            std::__cxx11::string::operator=((string *)local_30,(string *)&local_100);
            std::__cxx11::string::~string((string *)&local_100);
          }
          else {
            bVar1 = std::operator==(value_local,"AVAILABLE_VIRTUAL_MEMORY");
            if (bVar1) {
              sVar3 = cmsys::SystemInformation::GetAvailableVirtualMemory
                                ((SystemInformation *)key_local);
              ValueToString_abi_cxx11_(&local_120,this,sVar3);
              std::__cxx11::string::operator=((string *)local_30,(string *)&local_120);
              std::__cxx11::string::~string((string *)&local_120);
            }
            else {
              bVar1 = std::operator==(value_local,"TOTAL_PHYSICAL_MEMORY");
              if (bVar1) {
                sVar3 = cmsys::SystemInformation::GetTotalPhysicalMemory
                                  ((SystemInformation *)key_local);
                ValueToString_abi_cxx11_(&local_140,this,sVar3);
                std::__cxx11::string::operator=((string *)local_30,(string *)&local_140);
                std::__cxx11::string::~string((string *)&local_140);
              }
              else {
                bVar1 = std::operator==(value_local,"AVAILABLE_PHYSICAL_MEMORY");
                if (!bVar1) {
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_180,"does not recognize <key> ",value_local);
                  cmCommand::SetError(&this->super_cmCommand,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_180);
                  this_local._7_1_ = 0;
                  std::__cxx11::string::~string((string *)local_180);
                  goto LAB_006032f0;
                }
                sVar3 = cmsys::SystemInformation::GetAvailablePhysicalMemory
                                  ((SystemInformation *)key_local);
                ValueToString_abi_cxx11_((string *)((long)&e.field_2 + 8),this,sVar3);
                std::__cxx11::string::operator=
                          ((string *)local_30,(string *)(e.field_2._M_local_buf + 8));
                std::__cxx11::string::~string((string *)(e.field_2._M_local_buf + 8));
              }
            }
          }
        }
      }
    }
  }
  this_local._7_1_ = 1;
LAB_006032f0:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCMakeHostSystemInformationCommand
::GetValue(cmsys::SystemInformation &info,
           std::string const& key, std::string &value)
{
  if(key == "NUMBER_OF_LOGICAL_CORES")
    {
    value = this->ValueToString(info.GetNumberOfLogicalCPU());
    }
  else if(key == "NUMBER_OF_PHYSICAL_CORES")
    {
    value = this->ValueToString(info.GetNumberOfPhysicalCPU());
    }
  else if(key == "HOSTNAME")
    {
    value = this->ValueToString(info.GetHostname());
    }
  else if(key == "FQDN")
    {
    value = this->ValueToString(info.GetFullyQualifiedDomainName());
    }
  else if(key == "TOTAL_VIRTUAL_MEMORY")
    {
    value = this->ValueToString(info.GetTotalVirtualMemory());
    }
  else if(key == "AVAILABLE_VIRTUAL_MEMORY")
    {
    value = this->ValueToString(info.GetAvailableVirtualMemory());
    }
  else if(key == "TOTAL_PHYSICAL_MEMORY")
    {
    value = this->ValueToString(info.GetTotalPhysicalMemory());
    }
  else if(key == "AVAILABLE_PHYSICAL_MEMORY")
    {
    value = this->ValueToString(info.GetAvailablePhysicalMemory());
    }
  else
    {
    std::string e = "does not recognize <key> " + key;
    this->SetError(e);
    return false;
    }

  return true;
}